

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O0

void __thiscall Graph::auxIsTree(Graph *this,Vertex *v,int *markeds,bool *isCycle)

{
  bool bVar1;
  ostream *this_00;
  Vertex *v_00;
  Edge *local_30;
  Edge *a;
  bool *isCycle_local;
  int *markeds_local;
  Vertex *v_local;
  Graph *this_local;
  
  if (v == (Vertex *)0x0) {
    this_00 = std::operator<<((ostream *)&std::cout,"\n No NULL \n");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  else {
    bVar1 = Vertex::getMarked(v);
    if (bVar1) {
      *isCycle = true;
    }
    else {
      Vertex::setMarked(v,true);
      *markeds = *markeds + 1;
      for (local_30 = Vertex::getEdgesList(v); local_30 != (Edge *)0x0;
          local_30 = Edge::getNext(local_30)) {
        while( true ) {
          bVar1 = false;
          if (local_30 != (Edge *)0x0) {
            bVar1 = Edge::isClosed(local_30);
            bVar1 = !bVar1;
          }
          if (!bVar1) break;
          local_30 = Edge::getNext(local_30);
        }
        if (local_30 == (Edge *)0x0) {
          return;
        }
        v_00 = Edge::getDestiny(local_30);
        auxIsTree(this,v_00,markeds,isCycle);
      }
    }
  }
  return;
}

Assistant:

void Graph::auxIsTree(Vertex *v, int &markeds, bool &isCycle){
    if(v == NULL)
        cout<<"\n No NULL \n"<<endl;
    else{
        if(v->getMarked() == false){
            v->setMarked(true);
            markeds++;

            for(Edge *a= v->getEdgesList(); a!=NULL; a= a->getNext()){

                //nao descer por arcos com chave aberta
                while(a!=NULL && a->isClosed() == false){
                    a = a->getNext();
                }

                if(a==NULL)
                    break;

                auxIsTree(a->getDestiny(), markeds, isCycle);
            }
        }
        else
            isCycle = true;
    }
}